

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.cpp
# Opt level: O2

void check_eq_file(string *src_name)

{
  string dst_name;
  encoder e;
  allocator<char> local_461;
  string local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_coder local_420;
  
  std::operator+(&local_440,src_name,"_");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"encoded",&local_461);
  encoder::encoder((encoder *)&local_420,src_name,&local_460);
  std::__cxx11::string::~string((string *)&local_460);
  encoder::encode((encoder *)&local_420);
  basic_coder::~basic_coder(&local_420);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"encoded",&local_461);
  decoder::decoder((decoder *)&local_420,&local_460,&local_440);
  std::__cxx11::string::~string((string *)&local_460);
  decoder::decode((decoder *)&local_420);
  basic_coder::~basic_coder(&local_420);
  remove("encoded");
  cmp_files(src_name,&local_440);
  remove(local_440._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_440);
  return;
}

Assistant:

void check_eq_file(const std::string& src_name) {
    std::string dst_name = src_name + "_";
    {
        encoder e(src_name, "encoded");
        e.encode();
    }
    {
        decoder d("encoded", dst_name);
        d.decode();
    }

    std::remove("encoded");

    cmp_files(src_name, dst_name);
    std::remove(dst_name.c_str());
}